

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_modifiers.cc
# Opt level: O0

ctemplate * __thiscall
ctemplate::PrettyPrintOneModifier_abi_cxx11_(ctemplate *this,ModifierAndValue *modval)

{
  ModifierAndValue *modval_local;
  string *out;
  
  std::__cxx11::string::string((string *)this);
  std::__cxx11::string::append((char *)this);
  if (modval->modifier_info->short_name == '\0') {
    std::__cxx11::string::append((string *)this);
  }
  else {
    std::__cxx11::string::append((ulong)this,'\x01');
  }
  if (modval->value_len != 0) {
    std::__cxx11::string::append((char *)this,(ulong)modval->value);
  }
  return this;
}

Assistant:

string PrettyPrintOneModifier(const ModifierAndValue& modval) {
  string out;
  out.append(":");
  if (modval.modifier_info->short_name)      // short_name is a char.
    out.append(1, modval.modifier_info->short_name);
  else
    out.append(modval.modifier_info->long_name);
  if (modval.value_len != 0)
    out.append(modval.value, modval.value_len);
  return out;
}